

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_byteop(compiler_state_t *cstate,int op,int idx,int val)

{
  slist *psVar1;
  block *pbVar2;
  int code;
  
  if (op == 0x26) {
    code = 0x54;
  }
  else {
    if (op == 0x3c) {
      pbVar2 = gen_ncmp(cstate,OR_LINKHDR,idx,0x10,0xffffffff,0x30,1,val);
      return pbVar2;
    }
    if (op == 0x3d) {
      pbVar2 = gen_cmp(cstate,OR_LINKHDR,idx,0x10,val);
      return pbVar2;
    }
    if (op == 0x3e) {
      pbVar2 = gen_cmp_gt(cstate,OR_LINKHDR,idx,0x10,val);
      return pbVar2;
    }
    if (op != 0x7c) {
      abort();
    }
    code = 0x44;
  }
  psVar1 = new_stmt(cstate,code);
  (psVar1->s).k = val;
  pbVar2 = new_block(cstate,0x15);
  pbVar2->stmts = psVar1;
  pbVar2->sense = (uint)(pbVar2->sense == 0);
  return pbVar2;
}

Assistant:

struct block *
gen_byteop(compiler_state_t *cstate, int op, int idx, int val)
{
	struct block *b;
	struct slist *s;

	switch (op) {
	default:
		abort();

	case '=':
		return gen_cmp(cstate, OR_LINKHDR, (u_int)idx, BPF_B, (bpf_int32)val);

	case '<':
		b = gen_cmp_lt(cstate, OR_LINKHDR, (u_int)idx, BPF_B, (bpf_int32)val);
		return b;

	case '>':
		b = gen_cmp_gt(cstate, OR_LINKHDR, (u_int)idx, BPF_B, (bpf_int32)val);
		return b;

	case '|':
		s = new_stmt(cstate, BPF_ALU|BPF_OR|BPF_K);
		break;

	case '&':
		s = new_stmt(cstate, BPF_ALU|BPF_AND|BPF_K);
		break;
	}
	s->s.k = val;
	b = new_block(cstate, JMP(BPF_JEQ));
	b->stmts = s;
	gen_not(b);

	return b;
}